

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_extension.cpp
# Opt level: O0

void duckdb::JemallocExtension::FlushAll(void)

{
  string purge_arena;
  string local_20 [32];
  
  SetJemallocCTL((char *)0x2453240);
  PurgeArenaString_abi_cxx11_(purge_arena._0_8_);
  ::std::__cxx11::string::c_str();
  SetJemallocCTL((char *)0x2453264);
  SetJemallocCTL((char *)0x2453272);
  ::std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void JemallocExtension::FlushAll() {
	// Flush thread-local cache
	SetJemallocCTL("thread.tcache.flush");

	// Flush all arenas
	const auto purge_arena = PurgeArenaString(MALLCTL_ARENAS_ALL);
	SetJemallocCTL(purge_arena.c_str());

	// Reset the peak after resetting
	SetJemallocCTL("thread.peak.reset");
}